

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_common.hpp
# Opt level: O3

ostream * Catch::operator<<(ostream *os,pluralise *pluraliser)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(pluraliser->m_label)._M_dataplus._M_p,(pluraliser->m_label)._M_string_length);
  if (pluraliser->m_count != 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"s",1);
  }
  return os;
}

Assistant:

std::ostream& operator << ( std::ostream& os, pluralise const& pluraliser ) {
        os << pluraliser.m_count << " " << pluraliser.m_label;
        if( pluraliser.m_count != 1 )
            os << "s";
        return os;
    }